

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void analyzeOneTable(Parse *pParse,Table *pTab,Index *pOnlyIdx,int iStatCur,int iMem,int iTab)

{
  ushort uVar1;
  sqlite3 *db_00;
  bool bVar2;
  int iVar3;
  int x;
  int iVar4;
  Vdbe *p;
  int iVar5;
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  char *pColl;
  int *aGotoChng;
  int endDistinctTest;
  int nColTest;
  char *zIdxName;
  int addrNextRow;
  int addrRewind;
  int nCol;
  int regPrev;
  int regStat1;
  int regIdxname;
  int regTabname;
  int regTemp;
  int regChng;
  int regStat4;
  int regNewRowid;
  u8 needTableCnt;
  int iDb;
  int jZeroRows;
  int i;
  Vdbe *v;
  int iTabCur;
  int iIdxCur;
  Index *pIdx;
  sqlite3 *db;
  int p1;
  uint in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int op;
  Vdbe *in_stack_ffffffffffffff58;
  Parse *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int iVar6;
  Parse *in_stack_ffffffffffffff70;
  int local_4c;
  long local_38;
  
  db_00 = (sqlite3 *)*in_RDI;
  bVar2 = true;
  iVar5 = in_R8D + 7;
  op = iVar5;
  if (iVar5 < *(int *)((long)in_RDI + 0x54)) {
    op = *(int *)((long)in_RDI + 0x54);
  }
  *(int *)((long)in_RDI + 0x54) = op;
  p = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if ((((p != (Vdbe *)0x0) && (in_RSI != (undefined8 *)0x0)) && (*(int *)((long)in_RSI + 0x3c) != 0)
      ) && (iVar3 = sqlite3_strnicmp((char *)*in_RSI,"sqlite_",7), iVar3 != 0)) {
    sqlite3SchemaToIndex(db_00,(Schema *)in_RSI[0xe]);
    iVar3 = sqlite3AuthCheck((Parse *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                             (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                             (char *)in_stack_ffffffffffffff58,
                             (char *)CONCAT44(op,in_stack_ffffffffffffff50),
                             (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (iVar3 == 0) {
      sqlite3TableLock(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68
                       ,(u8)((ulong)in_stack_ffffffffffffff60 >> 0x38),
                       (char *)in_stack_ffffffffffffff58);
      iVar3 = in_R9D + 2;
      if (iVar3 < *(int *)(in_RDI + 10)) {
        iVar3 = *(int *)(in_RDI + 10);
      }
      *(int *)(in_RDI + 10) = iVar3;
      sqlite3OpenTable(in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                       (int)in_stack_ffffffffffffff58,(Table *)CONCAT44(op,iVar3),
                       in_stack_ffffffffffffff4c);
      p1 = 0;
      sqlite3VdbeAddOp4((Vdbe *)CONCAT44(op,iVar3),in_stack_ffffffffffffff4c,
                        in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                        in_stack_ffffffffffffff40,(char *)((ulong)in_stack_ffffffffffffff3c << 0x20)
                        ,(int)in_stack_ffffffffffffff60);
      for (local_38 = in_RSI[2]; local_38 != 0; local_38 = *(long *)(local_38 + 0x28)) {
        if ((in_RDX == 0) || (in_RDX == local_38)) {
          if (*(long *)(local_38 + 0x48) == 0) {
            bVar2 = false;
          }
          if (((*(byte *)(in_RSI + 9) & 0x20) == 0) || ((*(byte *)(local_38 + 0x5b) & 3) != 2)) {
            uVar1 = *(ushort *)(local_38 + 0x58);
            if ((*(byte *)(local_38 + 0x5b) >> 3 & 1) != 0) {
              uVar1 = *(ushort *)(local_38 + 0x56);
            }
            in_stack_ffffffffffffff4c = uVar1 - 1;
            iVar6 = in_stack_ffffffffffffff4c;
          }
          else {
            iVar6 = *(ushort *)(local_38 + 0x56) - 1;
          }
          p1 = 0;
          sqlite3VdbeAddOp4((Vdbe *)CONCAT44(op,iVar3),in_stack_ffffffffffffff4c,
                            in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                            in_stack_ffffffffffffff40,
                            (char *)((ulong)in_stack_ffffffffffffff3c << 0x20),
                            (int)in_stack_ffffffffffffff60);
          if (iVar5 + iVar6 < *(int *)((long)in_RDI + 0x54)) {
            in_stack_ffffffffffffff48 = *(int *)((long)in_RDI + 0x54);
          }
          else {
            in_stack_ffffffffffffff48 = iVar5 + iVar6;
          }
          *(int *)((long)in_RDI + 0x54) = in_stack_ffffffffffffff48;
          sqlite3VdbeAddOp3(in_stack_ffffffffffffff58,op,iVar3,in_stack_ffffffffffffff4c,
                            in_stack_ffffffffffffff48);
          sqlite3VdbeSetP4KeyInfo
                    ((Parse *)CONCAT44(op,iVar3),
                     (Index *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            in_stack_ffffffffffffff3c,p1,0);
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            in_stack_ffffffffffffff3c,p1,0);
          sqlite3VdbeAddOp3(in_stack_ffffffffffffff58,op,iVar3,in_stack_ffffffffffffff4c,
                            in_stack_ffffffffffffff48);
          sqlite3VdbeChangeP4((Vdbe *)in_stack_ffffffffffffff60,
                              (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                              (char *)CONCAT44(op,iVar3),in_stack_ffffffffffffff4c);
          sqlite3VdbeChangeP5(p,'\x02');
          sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            in_stack_ffffffffffffff3c,p1);
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            in_stack_ffffffffffffff3c,p1,0);
          sqlite3VdbeCurrentAddr(p);
          if (0 < iVar6) {
            x = sqlite3VdbeMakeLabel
                          ((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            in_stack_ffffffffffffff60 =
                 (Parse *)sqlite3DbMallocRaw((sqlite3 *)
                                             CONCAT44(in_stack_ffffffffffffff4c,
                                                      in_stack_ffffffffffffff48),
                                             CONCAT44(in_stack_ffffffffffffff44,
                                                      in_stack_ffffffffffffff40));
            if (in_stack_ffffffffffffff60 == (Parse *)0x0) goto LAB_001a98db;
            sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              in_stack_ffffffffffffff3c);
            sqlite3VdbeCurrentAddr(p);
            if (((iVar6 == 1) && (*(short *)(local_38 + 0x56) == 1)) &&
               (*(char *)(local_38 + 0x5a) != '\0')) {
              sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                ),in_stack_ffffffffffffff3c,p1,0);
            }
            for (local_4c = 0; local_4c < iVar6; local_4c = local_4c + 1) {
              in_stack_ffffffffffffff58 =
                   (Vdbe *)sqlite3LocateCollSeq
                                     ((Parse *)CONCAT44(op,iVar3),
                                      (char *)CONCAT44(in_stack_ffffffffffffff4c,
                                                       in_stack_ffffffffffffff48));
              sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                ),in_stack_ffffffffffffff3c,p1,0);
              sqlite3VdbeAddOp3(in_stack_ffffffffffffff58,op,iVar3,in_stack_ffffffffffffff4c,
                                in_stack_ffffffffffffff48);
              p1 = -4;
              iVar4 = sqlite3VdbeAddOp4((Vdbe *)CONCAT44(op,iVar3),in_stack_ffffffffffffff4c,
                                        in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                                        in_stack_ffffffffffffff40,
                                        (char *)CONCAT44(in_stack_ffffffffffffff3c,0xfffffffc),
                                        (int)in_stack_ffffffffffffff60);
              in_stack_ffffffffffffff60->aTempReg[(long)local_4c + -9] = iVar4;
              sqlite3VdbeChangeP5(p,0x80);
            }
            sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              in_stack_ffffffffffffff3c,p1,0);
            sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              in_stack_ffffffffffffff3c,p1,0);
            sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                ),in_stack_ffffffffffffff3c);
            for (local_4c = 0; local_4c < iVar6; local_4c = local_4c + 1) {
              sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,
                                                   in_stack_ffffffffffffff40),
                                  in_stack_ffffffffffffff3c);
              sqlite3VdbeAddOp3(in_stack_ffffffffffffff58,op,iVar3,in_stack_ffffffffffffff4c,
                                in_stack_ffffffffffffff48);
            }
            sqlite3VdbeResolveLabel(p,x);
            sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (void *)CONCAT44(in_stack_ffffffffffffff3c,p1));
          }
          sqlite3VdbeAddOp3(in_stack_ffffffffffffff58,op,iVar3,in_stack_ffffffffffffff4c,
                            in_stack_ffffffffffffff48);
          sqlite3VdbeChangeP4((Vdbe *)in_stack_ffffffffffffff60,
                              (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                              (char *)CONCAT44(op,iVar3),in_stack_ffffffffffffff4c);
          sqlite3VdbeChangeP5(p,'\x02');
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            in_stack_ffffffffffffff3c,p1,0);
          callStatGet((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                      in_stack_ffffffffffffff3c,p1,0);
          p1 = 0;
          sqlite3VdbeAddOp4((Vdbe *)CONCAT44(op,iVar3),in_stack_ffffffffffffff4c,
                            in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                            in_stack_ffffffffffffff40,
                            (char *)((ulong)in_stack_ffffffffffffff3c << 0x20),
                            (int)in_stack_ffffffffffffff60);
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            in_stack_ffffffffffffff3c,p1,0);
          sqlite3VdbeAddOp3(in_stack_ffffffffffffff58,op,iVar3,in_stack_ffffffffffffff4c,
                            in_stack_ffffffffffffff48);
          sqlite3VdbeChangeP5(p,'\b');
          sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              in_stack_ffffffffffffff3c);
        }
LAB_001a98db:
      }
      if ((in_RDX == 0) && (bVar2)) {
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          in_stack_ffffffffffffff3c,p1,0);
        iVar6 = (int)in_stack_ffffffffffffff60;
        sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          in_stack_ffffffffffffff3c,p1);
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          in_stack_ffffffffffffff3c,p1,0);
        iVar5 = 0;
        sqlite3VdbeAddOp4((Vdbe *)CONCAT44(op,iVar3),in_stack_ffffffffffffff4c,
                          in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                          in_stack_ffffffffffffff40,
                          (char *)((ulong)in_stack_ffffffffffffff3c << 0x20),iVar6);
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          in_stack_ffffffffffffff3c,iVar5,0);
        sqlite3VdbeAddOp3(in_stack_ffffffffffffff58,op,iVar3,in_stack_ffffffffffffff4c,
                          in_stack_ffffffffffffff48);
        sqlite3VdbeChangeP5(p,'\b');
        sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            in_stack_ffffffffffffff3c);
      }
    }
  }
  return;
}

Assistant:

static void analyzeOneTable(
  Parse *pParse,   /* Parser context */
  Table *pTab,     /* Table whose indices are to be analyzed */
  Index *pOnlyIdx, /* If not NULL, only analyze this one index */
  int iStatCur,    /* Index of VdbeCursor that writes the sqlite_stat1 table */
  int iMem,        /* Available memory locations begin here */
  int iTab         /* Next available cursor */
){
  sqlite3 *db = pParse->db;    /* Database handle */
  Index *pIdx;                 /* An index to being analyzed */
  int iIdxCur;                 /* Cursor open on index being analyzed */
  int iTabCur;                 /* Table cursor */
  Vdbe *v;                     /* The virtual machine being built up */
  int i;                       /* Loop counter */
  int jZeroRows = -1;          /* Jump from here if number of rows is zero */
  int iDb;                     /* Index of database containing pTab */
  u8 needTableCnt = 1;         /* True to count the table */
  int regNewRowid = iMem++;    /* Rowid for the inserted record */
  int regStat4 = iMem++;       /* Register to hold Stat4Accum object */
  int regChng = iMem++;        /* Index of changed index field */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  int regRowid = iMem++;       /* Rowid argument passed to stat_push() */
#endif
  int regTemp = iMem++;        /* Temporary use register */
  int regTabname = iMem++;     /* Register containing table name */
  int regIdxname = iMem++;     /* Register containing index name */
  int regStat1 = iMem++;       /* Value for the stat column of sqlite_stat1 */
  int regPrev = iMem;          /* MUST BE LAST (see below) */

  pParse->nMem = MAX(pParse->nMem, iMem);
  v = sqlite3GetVdbe(pParse);
  if( v==0 || NEVER(pTab==0) ){
    return;
  }
  if( pTab->tnum==0 ){
    /* Do not gather statistics on views or virtual tables */
    return;
  }
  if( sqlite3_strnicmp(pTab->zName, "sqlite_", 7)==0 ){
    /* Do not gather statistics on system tables */
    return;
  }
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 );
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_ANALYZE, pTab->zName, 0,
      db->aDb[iDb].zName ) ){
    return;
  }
#endif

  /* Establish a read-lock on the table at the shared-cache level. 
  ** Open a read-only cursor on the table. Also allocate a cursor number
  ** to use for scanning indexes (iIdxCur). No index cursor is opened at
  ** this time though.  */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);
  iTabCur = iTab++;
  iIdxCur = iTab++;
  pParse->nTab = MAX(pParse->nTab, iTab);
  sqlite3OpenTable(pParse, iTabCur, iDb, pTab, OP_OpenRead);
  sqlite3VdbeAddOp4(v, OP_String8, 0, regTabname, 0, pTab->zName, 0);

  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    int nCol;                     /* Number of columns in pIdx. "N" */
    int addrRewind;               /* Address of "OP_Rewind iIdxCur" */
    int addrNextRow;              /* Address of "next_row:" */
    const char *zIdxName;         /* Name of the index */
    int nColTest;                 /* Number of columns to test for changes */

    if( pOnlyIdx && pOnlyIdx!=pIdx ) continue;
    if( pIdx->pPartIdxWhere==0 ) needTableCnt = 0;
    if( !HasRowid(pTab) && IsPrimaryKeyIndex(pIdx) ){
      nCol = pIdx->nKeyCol;
      zIdxName = pTab->zName;
      nColTest = nCol - 1;
    }else{
      nCol = pIdx->nColumn;
      zIdxName = pIdx->zName;
      nColTest = pIdx->uniqNotNull ? pIdx->nKeyCol-1 : nCol-1;
    }

    /* Populate the register containing the index name. */
    sqlite3VdbeAddOp4(v, OP_String8, 0, regIdxname, 0, zIdxName, 0);
    VdbeComment((v, "Analysis for %s.%s", pTab->zName, zIdxName));

    /*
    ** Pseudo-code for loop that calls stat_push():
    **
    **   Rewind csr
    **   if eof(csr) goto end_of_scan;
    **   regChng = 0
    **   goto chng_addr_0;
    **
    **  next_row:
    **   regChng = 0
    **   if( idx(0) != regPrev(0) ) goto chng_addr_0
    **   regChng = 1
    **   if( idx(1) != regPrev(1) ) goto chng_addr_1
    **   ...
    **   regChng = N
    **   goto chng_addr_N
    **
    **  chng_addr_0:
    **   regPrev(0) = idx(0)
    **  chng_addr_1:
    **   regPrev(1) = idx(1)
    **  ...
    **
    **  endDistinctTest:
    **   regRowid = idx(rowid)
    **   stat_push(P, regChng, regRowid)
    **   Next csr
    **   if !eof(csr) goto next_row;
    **
    **  end_of_scan:
    */

    /* Make sure there are enough memory cells allocated to accommodate 
    ** the regPrev array and a trailing rowid (the rowid slot is required
    ** when building a record to insert into the sample column of 
    ** the sqlite_stat4 table.  */
    pParse->nMem = MAX(pParse->nMem, regPrev+nColTest);

    /* Open a read-only cursor on the index being analyzed. */
    assert( iDb==sqlite3SchemaToIndex(db, pIdx->pSchema) );
    sqlite3VdbeAddOp3(v, OP_OpenRead, iIdxCur, pIdx->tnum, iDb);
    sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
    VdbeComment((v, "%s", pIdx->zName));

    /* Invoke the stat_init() function. The arguments are:
    ** 
    **    (1) the number of columns in the index including the rowid
    **        (or for a WITHOUT ROWID table, the number of PK columns),
    **    (2) the number of columns in the key without the rowid/pk
    **    (3) the number of rows in the index,
    **
    **
    ** The third argument is only used for STAT3 and STAT4
    */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3VdbeAddOp2(v, OP_Count, iIdxCur, regStat4+3);
#endif
    sqlite3VdbeAddOp2(v, OP_Integer, nCol, regStat4+1);
    sqlite3VdbeAddOp2(v, OP_Integer, pIdx->nKeyCol, regStat4+2);
    sqlite3VdbeAddOp3(v, OP_Function, 0, regStat4+1, regStat4);
    sqlite3VdbeChangeP4(v, -1, (char*)&statInitFuncdef, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, 2+IsStat34);

    /* Implementation of the following:
    **
    **   Rewind csr
    **   if eof(csr) goto end_of_scan;
    **   regChng = 0
    **   goto next_push_0;
    **
    */
    addrRewind = sqlite3VdbeAddOp1(v, OP_Rewind, iIdxCur);
    VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Integer, 0, regChng);
    addrNextRow = sqlite3VdbeCurrentAddr(v);

    if( nColTest>0 ){
      int endDistinctTest = sqlite3VdbeMakeLabel(v);
      int *aGotoChng;               /* Array of jump instruction addresses */
      aGotoChng = sqlite3DbMallocRaw(db, sizeof(int)*nColTest);
      if( aGotoChng==0 ) continue;

      /*
      **  next_row:
      **   regChng = 0
      **   if( idx(0) != regPrev(0) ) goto chng_addr_0
      **   regChng = 1
      **   if( idx(1) != regPrev(1) ) goto chng_addr_1
      **   ...
      **   regChng = N
      **   goto endDistinctTest
      */
      sqlite3VdbeAddOp0(v, OP_Goto);
      addrNextRow = sqlite3VdbeCurrentAddr(v);
      if( nColTest==1 && pIdx->nKeyCol==1 && IsUniqueIndex(pIdx) ){
        /* For a single-column UNIQUE index, once we have found a non-NULL
        ** row, we know that all the rest will be distinct, so skip 
        ** subsequent distinctness tests. */
        sqlite3VdbeAddOp2(v, OP_NotNull, regPrev, endDistinctTest);
        VdbeCoverage(v);
      }
      for(i=0; i<nColTest; i++){
        char *pColl = (char*)sqlite3LocateCollSeq(pParse, pIdx->azColl[i]);
        sqlite3VdbeAddOp2(v, OP_Integer, i, regChng);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, i, regTemp);
        aGotoChng[i] = 
        sqlite3VdbeAddOp4(v, OP_Ne, regTemp, 0, regPrev+i, pColl, P4_COLLSEQ);
        sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
        VdbeCoverage(v);
      }
      sqlite3VdbeAddOp2(v, OP_Integer, nColTest, regChng);
      sqlite3VdbeAddOp2(v, OP_Goto, 0, endDistinctTest);
  
  
      /*
      **  chng_addr_0:
      **   regPrev(0) = idx(0)
      **  chng_addr_1:
      **   regPrev(1) = idx(1)
      **  ...
      */
      sqlite3VdbeJumpHere(v, addrNextRow-1);
      for(i=0; i<nColTest; i++){
        sqlite3VdbeJumpHere(v, aGotoChng[i]);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, i, regPrev+i);
      }
      sqlite3VdbeResolveLabel(v, endDistinctTest);
      sqlite3DbFree(db, aGotoChng);
    }
  
    /*
    **  chng_addr_N:
    **   regRowid = idx(rowid)            // STAT34 only
    **   stat_push(P, regChng, regRowid)  // 3rd parameter STAT34 only
    **   Next csr
    **   if !eof(csr) goto next_row;
    */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    assert( regRowid==(regStat4+2) );
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp2(v, OP_IdxRowid, iIdxCur, regRowid);
    }else{
      Index *pPk = sqlite3PrimaryKeyIndex(pIdx->pTable);
      int j, k, regKey;
      regKey = sqlite3GetTempRange(pParse, pPk->nKeyCol);
      for(j=0; j<pPk->nKeyCol; j++){
        k = sqlite3ColumnOfIndex(pIdx, pPk->aiColumn[j]);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, k, regKey+j);
        VdbeComment((v, "%s", pTab->aCol[pPk->aiColumn[j]].zName));
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regKey, pPk->nKeyCol, regRowid);
      sqlite3ReleaseTempRange(pParse, regKey, pPk->nKeyCol);
    }
#endif
    assert( regChng==(regStat4+1) );
    sqlite3VdbeAddOp3(v, OP_Function, 1, regStat4, regTemp);
    sqlite3VdbeChangeP4(v, -1, (char*)&statPushFuncdef, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, 2+IsStat34);
    sqlite3VdbeAddOp2(v, OP_Next, iIdxCur, addrNextRow); VdbeCoverage(v);

    /* Add the entry to the stat1 table. */
    callStatGet(v, regStat4, STAT_GET_STAT1, regStat1);
    assert( "BBB"[0]==SQLITE_AFF_TEXT );
    sqlite3VdbeAddOp4(v, OP_MakeRecord, regTabname, 3, regTemp, "BBB", 0);
    sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur, regNewRowid);
    sqlite3VdbeAddOp3(v, OP_Insert, iStatCur, regTemp, regNewRowid);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);

    /* Add the entries to the stat3 or stat4 table. */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    {
      int regEq = regStat1;
      int regLt = regStat1+1;
      int regDLt = regStat1+2;
      int regSample = regStat1+3;
      int regCol = regStat1+4;
      int regSampleRowid = regCol + nCol;
      int addrNext;
      int addrIsNull;
      u8 seekOp = HasRowid(pTab) ? OP_NotExists : OP_NotFound;

      pParse->nMem = MAX(pParse->nMem, regCol+nCol);

      addrNext = sqlite3VdbeCurrentAddr(v);
      callStatGet(v, regStat4, STAT_GET_ROWID, regSampleRowid);
      addrIsNull = sqlite3VdbeAddOp1(v, OP_IsNull, regSampleRowid);
      VdbeCoverage(v);
      callStatGet(v, regStat4, STAT_GET_NEQ, regEq);
      callStatGet(v, regStat4, STAT_GET_NLT, regLt);
      callStatGet(v, regStat4, STAT_GET_NDLT, regDLt);
      sqlite3VdbeAddOp4Int(v, seekOp, iTabCur, addrNext, regSampleRowid, 0);
      /* We know that the regSampleRowid row exists because it was read by
      ** the previous loop.  Thus the not-found jump of seekOp will never
      ** be taken */
      VdbeCoverageNeverTaken(v);
#ifdef SQLITE_ENABLE_STAT3
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur, 
                                      pIdx->aiColumn[0], regSample);
#else
      for(i=0; i<nCol; i++){
        i16 iCol = pIdx->aiColumn[i];
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur, iCol, regCol+i);
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regCol, nCol, regSample);
#endif
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regTabname, 6, regTemp);
      sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur+1, regNewRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iStatCur+1, regTemp, regNewRowid);
      sqlite3VdbeAddOp2(v, OP_Goto, 1, addrNext); /* P1==1 for end-of-loop */
      sqlite3VdbeJumpHere(v, addrIsNull);
    }
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */

    /* End of analysis */
    sqlite3VdbeJumpHere(v, addrRewind);
  }


  /* Create a single sqlite_stat1 entry containing NULL as the index
  ** name and the row count as the content.
  */
  if( pOnlyIdx==0 && needTableCnt ){
    VdbeComment((v, "%s", pTab->zName));
    sqlite3VdbeAddOp2(v, OP_Count, iTabCur, regStat1);
    jZeroRows = sqlite3VdbeAddOp1(v, OP_IfNot, regStat1); VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Null, 0, regIdxname);
    assert( "BBB"[0]==SQLITE_AFF_TEXT );
    sqlite3VdbeAddOp4(v, OP_MakeRecord, regTabname, 3, regTemp, "BBB", 0);
    sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur, regNewRowid);
    sqlite3VdbeAddOp3(v, OP_Insert, iStatCur, regTemp, regNewRowid);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
    sqlite3VdbeJumpHere(v, jZeroRows);
  }
}